

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

Option<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
 __thiscall
Lib::
Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
::tryGet(Map<const_Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_*,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::DerefPtrHash<Lib::StlHash>_>
         *this,Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> **key)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  undefined8 *in_RDX;
  ulong uVar4;
  Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *pPVar5;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **ppMVar6;
  hash<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> local_29;
  
  sVar3 = std::hash<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator()
                    (&local_29,(Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *)*in_RDX)
  ;
  uVar4 = 1;
  if (1 < (uint)sVar3) {
    uVar4 = sVar3 & 0xffffffff;
  }
  iVar2 = (int)key[1][uVar4 % (ulong)*(uint *)key]._summands._capacity;
  if (iVar2 != 0) {
    pPVar5 = key[1] + uVar4 % (ulong)*(uint *)key;
    do {
      if (iVar2 == (int)uVar4) {
        bVar1 = Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::operator==
                          ((Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                            *)(pPVar5->_summands)._stack,
                           (Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
                            *)*in_RDX);
        if (bVar1) {
          ppMVar6 = &(pPVar5->_summands)._cursor;
          goto LAB_002f3600;
        }
      }
      pPVar5 = pPVar5 + 1;
      if (pPVar5 == key[2]) {
        pPVar5 = key[1];
      }
      iVar2 = (int)(pPVar5->_summands)._capacity;
    } while (iVar2 != 0);
  }
  this->_capacity = 0;
  this->_noOfEntries = 0;
  ppMVar6 = (Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> **)0x0;
LAB_002f3600:
  *(Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> ***)this = ppMVar6;
  return (OptionBase<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
          )(OptionBase<const_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>_&>
            )this;
}

Assistant:

Option<Val const&> tryGet(Key const& key) const
  {
    using Opt = Option<Val const&>;

    auto code = hashCode(key);
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return Opt(entry->value());
      }
    }

    return Opt();
  }